

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

VoidPromiseAndPipeline * __thiscall
capnp::LocalClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  undefined8 *puVar2;
  ClientHook *pCVar3;
  ClientHook *pCVar4;
  undefined8 uVar5;
  CallContextHook *pCVar6;
  LocalClient *pLVar7;
  PromiseNode *pPVar8;
  Disposer *pDVar9;
  ForkBranchBase *pFVar10;
  Refcounted *refcounted;
  QueuedPipeline *this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:476:34),_void>
  PVar11;
  Promise<void> PVar12;
  Own<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>,_kj::_::PropagateException>_>
  OVar13;
  Own<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,_capnp::AnyPointer::Pipeline,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:490:59),_kj::_::PropagateException>_>
  OVar14;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar15;
  ForkedPromise<void> forked;
  Promise<void> completionPromise;
  Promise<void> promise;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  CallContextHook *local_90;
  Own<capnp::LocalClient> local_88;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  PromiseNode *pPStack_58;
  ExceptionOrValue *local_50;
  ForkBranchBase *local_48;
  PromiseNode *pPStack_40;
  undefined1 local_38 [16];
  
  local_50 = (ExceptionOrValue *)context->ptr;
  pPStack_58 = (PromiseNode *)CONCAT62(pPStack_58._2_6_,methodId);
  local_68.disposer = (Disposer *)this;
  local_68.ptr = (PromiseNode *)interfaceId;
  kj::_::yield();
  PVar11 = kj::Promise<void>::
           then<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda()_1_,kj::_::PropagateException>
                     ((Promise<void> *)&local_88,(anon_class_32_4_d5fa3d7c_for_func *)local_a8,
                      (PropagateException *)&local_68);
  uVar5 = local_a8._8_8_;
  if ((PromiseNode *)local_a8._8_8_ != (PromiseNode *)0x0) {
    local_a8._8_8_ = (PromiseNode *)0x0;
    (**((ClientHook *)local_a8._0_8_)->_vptr_ClientHook)
              (local_a8._0_8_,(*(_func_int ***)uVar5)[-2] + (long)(_func_int ***)uVar5,
               PVar11.super_PromiseBase.node.ptr);
  }
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_a8._0_8_ = &this->super_Refcounted;
  local_a8._8_8_ = this;
  PVar12 = kj::Promise<void>::attach<kj::Own<capnp::LocalClient>>
                     ((Promise<void> *)local_38,&local_88);
  uVar5 = local_a8._8_8_;
  if ((LocalClient *)local_a8._8_8_ != (LocalClient *)0x0) {
    local_a8._8_8_ = (LocalClient *)0x0;
    (**((ClientHook *)local_a8._0_8_)->_vptr_ClientHook)
              (local_a8._0_8_,
               ((ClientHook *)uVar5)->_vptr_ClientHook[-2] +
               (long)&((ClientHook *)uVar5)->_vptr_ClientHook,PVar12.super_PromiseBase.node.ptr);
  }
  pLVar7 = local_88.ptr;
  if ((EventLoop *)local_88.ptr != (EventLoop *)0x0) {
    local_88.ptr = (LocalClient *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               (pLVar7->super_ClientHook)._vptr_ClientHook[-2] + (long)&pLVar7->super_ClientHook);
  }
  kj::Promise<void>::fork((Promise<void> *)&local_88);
  PVar12 = kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_98);
  (*context->ptr->_vptr_CallContextHook[7])
            (&local_48,context->ptr,PVar12.super_PromiseBase.node.ptr);
  local_68.ptr = &local_48->super_PromiseNode;
  pPStack_58 = pPStack_40;
  pPStack_40 = (PromiseNode *)0x0;
  OVar13 = kj::
           heap<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,kj::_::Void,kj::CaptureByMove<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
                     ((Own<kj::_::PromiseNode> *)local_a8,
                      (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>
                       *)local_98,(PropagateException *)&local_68);
  pPVar8 = pPStack_58;
  local_78.disposer._0_4_ = local_a8._0_4_;
  local_78.disposer._4_4_ = local_a8._4_4_;
  local_78.ptr = (PromiseNode *)local_a8._8_8_;
  if (pPStack_58 != (PromiseNode *)0x0) {
    pPStack_58 = (PromiseNode *)0x0;
    (**((PromiseNode *)&(local_68.ptr)->_vptr_PromiseNode)->_vptr_PromiseNode)
              (local_68.ptr,pPVar8->_vptr_PromiseNode[-2] + (long)&pPVar8->_vptr_PromiseNode,
               OVar13.ptr);
  }
  pPVar8 = pPStack_40;
  if (pPStack_40 != (PromiseNode *)0x0) {
    pPStack_40 = (PromiseNode *)0x0;
    (**(local_48->super_PromiseNode)._vptr_PromiseNode)
              (local_48,(long)pPVar8 + (long)(*(ForkBranchBase **)pPVar8)[-1].next);
  }
  pCVar6 = local_90;
  if (local_90 != (CallContextHook *)0x0) {
    local_90 = (CallContextHook *)0x0;
    (**(code **)*(_func_int **)local_98)
              (local_98,pCVar6->_vptr_CallContextHook[-2] + (long)&pCVar6->_vptr_CallContextHook);
  }
  (*context->ptr->_vptr_CallContextHook[5])(local_98);
  OVar14 = kj::
           heap<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,capnp::AnyPointer::Pipeline,capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(capnp::AnyPointer::Pipeline&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(capnp::AnyPointer::Pipeline&&)_1_,kj::_::PropagateException>
                     (&local_68,(anon_class_1_0_00000001_for_func *)local_98,
                      (PropagateException *)&local_48);
  pCVar6 = local_90;
  local_a8._0_8_ = local_68.disposer;
  local_a8._8_8_ = local_68.ptr;
  if (local_90 != (CallContextHook *)0x0) {
    local_90 = (CallContextHook *)0x0;
    (**(code **)*(_func_int **)local_98)
              (local_98,pCVar6->_vptr_CallContextHook[-2] + (long)&pCVar6->_vptr_CallContextHook,
               OVar14.ptr);
  }
  OVar15 = kj::
           heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_68,&local_78,(Own<kj::_::PromiseNode> *)local_a8);
  pDVar9 = local_68.disposer;
  puVar2 = (undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_);
  local_78.disposer._0_1_ = local_68.disposer._0_1_;
  local_78.disposer._1_3_ = local_68.disposer._1_3_;
  local_78.disposer._4_4_ = local_68.disposer._4_4_;
  pFVar10 = (ForkBranchBase *)local_68.ptr;
  local_68.disposer = pDVar9;
  if ((LocalClient *)local_78.ptr != (LocalClient *)0x0) {
    pCVar3 = (ClientHook *)&(local_78.ptr)->_vptr_PromiseNode;
    pCVar4 = (ClientHook *)&(local_78.ptr)->_vptr_PromiseNode;
    local_78.ptr = &((ForkBranchBase *)local_68.ptr)->super_PromiseNode;
    (**(code **)*puVar2)
              (puVar2,pCVar3->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook,OVar15.ptr);
    pFVar10 = (ForkBranchBase *)local_78.ptr;
  }
  local_78.ptr = &pFVar10->super_PromiseNode;
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_98);
  PVar12 = kj::Promise<void>::attach<kj::Own<capnp::CallContextHook>>
                     ((Promise<void> *)&local_68,(Own<capnp::CallContextHook> *)local_98);
  pCVar6 = local_90;
  if (local_90 != (CallContextHook *)0x0) {
    local_90 = (CallContextHook *)0x0;
    (**(code **)*(_func_int **)local_98)
              (local_98,pCVar6->_vptr_CallContextHook[-2] + (long)&pCVar6->_vptr_CallContextHook,
               PVar12.super_PromiseBase.node.ptr);
  }
  (__return_storage_ptr__->promise).super_PromiseBase.node.disposer = local_68.disposer;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = local_68.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  this_00 = (QueuedPipeline *)operator_new(0x48);
  QueuedPipeline::QueuedPipeline(this_00,(Promise<kj::Own<capnp::PipelineHook>_> *)&local_78);
  pPVar8 = local_68.ptr;
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (__return_storage_ptr__->pipeline).disposer = &(this_00->super_Refcounted).super_Disposer;
  (__return_storage_ptr__->pipeline).ptr = (PipelineHook *)this_00;
  if ((Disposer *)local_68.ptr != (Disposer *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**((ClientHook *)&(local_68.disposer)->_vptr_Disposer)->_vptr_ClientHook)
              (local_68.disposer,pPVar8->_vptr_PromiseNode[-2] + (long)&pPVar8->_vptr_PromiseNode);
  }
  uVar5 = local_a8._8_8_;
  if ((ForkBranchBase *)local_a8._8_8_ != (ForkBranchBase *)0x0) {
    local_a8._8_8_ = (ForkBranchBase *)0x0;
    (**((ClientHook *)local_a8._0_8_)->_vptr_ClientHook)
              (local_a8._0_8_,
               ((PromiseNode *)uVar5)->_vptr_PromiseNode[-2] + (long)(PromiseNode *)uVar5);
  }
  pPVar8 = local_78.ptr;
  if ((ForkBranchBase *)local_78.ptr != (ForkBranchBase *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_),
               ((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&pPVar8->_vptr_PromiseNode);
  }
  pLVar7 = local_88.ptr;
  if ((EventLoop *)local_88.ptr != (EventLoop *)0x0) {
    local_88.ptr = (LocalClient *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               (pLVar7->super_ClientHook)._vptr_ClientHook[-2] + (long)&pLVar7->super_ClientHook);
  }
  uVar5 = local_38._8_8_;
  if ((PromiseNode *)local_38._8_8_ != (PromiseNode *)0x0) {
    local_38._8_8_ = (PromiseNode *)0x0;
    (***(_func_int ***)local_38._0_8_)
              (local_38._0_8_,(char *)(uVar5 + (long)(*(_func_int ***)uVar5)[-2]));
  }
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    auto contextPtr = context.get();

    // We don't want to actually dispatch the call synchronously, because we don't want the callee
    // to have any side effects before the promise is returned to the caller.  This helps avoid
    // race conditions.
    //
    // So, we do an evalLater() here.
    //
    // Note also that QueuedClient depends on this evalLater() to ensure that pipelined calls don't
    // complete before 'whenMoreResolved()' promises resolve.
    auto promise = kj::evalLater([this,interfaceId,methodId,contextPtr]() {
      return server->dispatchCall(interfaceId, methodId,
                                  CallContext<AnyPointer, AnyPointer>(*contextPtr));
    }).attach(kj::addRef(*this));

    // We have to fork this promise for the pipeline to receive a copy of the answer.
    auto forked = promise.fork();

    auto pipelinePromise = forked.addBranch().then(kj::mvCapture(context->addRef(),
        [=](kj::Own<CallContextHook>&& context) -> kj::Own<PipelineHook> {
          context->releaseParams();
          return kj::refcounted<LocalPipeline>(kj::mv(context));
        }));

    auto tailPipelinePromise = context->onTailCall().then([](AnyPointer::Pipeline&& pipeline) {
      return kj::mv(pipeline.hook);
    });

    pipelinePromise = pipelinePromise.exclusiveJoin(kj::mv(tailPipelinePromise));

    auto completionPromise = forked.addBranch().attach(kj::mv(context));

    return VoidPromiseAndPipeline { kj::mv(completionPromise),
        kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise)) };
  }